

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QDockWidgetGroupWindow::restore(QDockWidgetGroupWindow *this)

{
  _func_int **pp_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  Alignment AVar4;
  undefined4 uVar5;
  Data *pDVar6;
  QDockAreaLayoutItem *pQVar7;
  qsizetype qVar8;
  bool bVar9;
  DockOptions DVar10;
  QLayout *pQVar11;
  QLayout *pQVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<QDockAreaLayoutItem> local_b8;
  undefined1 local_98 [56];
  QMainWindow *pQStack_60;
  QArrayDataPointer<QDockAreaLayoutItem> local_58;
  undefined8 local_40;
  QTabBar *pQStack_38;
  int local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar11 = QWidget::layout((QWidget *)this);
  bVar9 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)(pQVar11 + 8));
  if (!bVar9) {
    pQVar12 = QWidget::layout((QWidget *)this);
    pQVar12[4].super_QLayoutItem._vptr_QLayoutItem = *(_func_int ***)(pQVar11 + 8);
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)&pQVar12[4].super_QLayoutItem.align,
               (QArrayDataPointer<QWidget_*> *)&pQVar11[8].field_0x8);
    uVar2 = *(undefined4 *)&pQVar11[9].field_0x8;
    uVar3 = *(undefined4 *)&pQVar11[9].field_0xc;
    pp_Var1 = pQVar11[9].super_QLayoutItem._vptr_QLayoutItem;
    AVar4.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         pQVar11[9].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>;
    uVar5 = *(undefined4 *)&pQVar11[9].super_QLayoutItem.field_0xc;
    pQVar12[5].super_QLayoutItem._vptr_QLayoutItem = *(_func_int ***)(pQVar11 + 9);
    pQVar12[5].super_QLayoutItem.align = (Alignment)uVar2;
    *(undefined4 *)&pQVar12[5].super_QLayoutItem.field_0xc = uVar3;
    *(_func_int ***)(pQVar12 + 6) = pp_Var1;
    *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&pQVar12[6].field_0x8 =
         AVar4.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
    *(undefined4 *)&pQVar12[6].field_0xc = uVar5;
    QArrayDataPointer<QDockAreaLayoutItem>::operator=
              ((QArrayDataPointer<QDockAreaLayoutItem> *)&pQVar12[6].super_QLayoutItem,
               (QArrayDataPointer<QDockAreaLayoutItem> *)(pQVar11 + 10));
    uVar2 = *(undefined4 *)&pQVar11[10].super_QLayoutItem.field_0xc;
    pp_Var1 = *(_func_int ***)(pQVar11 + 0xb);
    *(QFlagsStorage<Qt::AlignmentFlag> *)&pQVar12[7].field_0x8 =
         (QFlagsStorage<Qt::AlignmentFlag>)
         pQVar11[10].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>;
    *(undefined4 *)&pQVar12[7].field_0xc = uVar2;
    pQVar12[7].super_QLayoutItem._vptr_QLayoutItem = pp_Var1;
    pQVar12[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = *(Int *)&pQVar11[0xb].field_0x8;
    QDockAreaLayoutInfo::QDockAreaLayoutInfo((QDockAreaLayoutInfo *)local_98);
    *(undefined8 *)(pQVar11 + 8) = local_98._0_8_;
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)&pQVar11[8].field_0x8,
               (QArrayDataPointer<QWidget_*> *)(local_98 + 8));
    qVar8 = local_58.size;
    pQVar7 = local_58.ptr;
    pDVar6 = local_58.d;
    pQVar11[9].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_98._48_8_;
    *(QMainWindow **)&pQVar11[9].super_QLayoutItem.align = pQStack_60;
    *(undefined8 *)(pQVar11 + 9) = local_98._32_8_;
    *(undefined8 *)&pQVar11[9].field_0x8 = local_98._40_8_;
    local_58.d = (Data *)0x0;
    local_58.ptr = (QDockAreaLayoutItem *)0x0;
    local_58.size = 0;
    local_b8.d = *(Data **)(pQVar11 + 10);
    local_b8.ptr = *(QDockAreaLayoutItem **)&pQVar11[10].field_0x8;
    *(Data **)(pQVar11 + 10) = pDVar6;
    *(QDockAreaLayoutItem **)&pQVar11[10].field_0x8 = pQVar7;
    local_b8.size = (qsizetype)pQVar11[10].super_QLayoutItem._vptr_QLayoutItem;
    pQVar11[10].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)qVar8;
    QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_b8);
    *(int *)&pQVar11[0xb].field_0x8 = local_30;
    *(undefined8 *)&pQVar11[10].super_QLayoutItem.align = local_40;
    *(QTabBar **)(pQVar11 + 0xb) = pQStack_38;
    QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer
              ((QArrayDataPointer<QDockAreaLayoutItem> *)(local_98 + 0x40));
    if ((QArrayData *)local_98._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._8_8_,8,0x10);
      }
    }
  }
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0xffffffffffffffff;
  QList<int>::clear((QList<int> *)(this + 0x38));
  adjustFlags(this);
  pQVar11 = QWidget::layout((QWidget *)this);
  QDockAreaLayoutInfo::fitItems((QDockAreaLayoutInfo *)&pQVar11[4].super_QLayoutItem);
  pQVar11 = QWidget::layout((QWidget *)this);
  DVar10 = QMainWindow::dockOptions(*(QMainWindow **)(*(long *)(this + 8) + 0x10));
  QDockAreaLayoutInfo::apply
            ((QDockAreaLayoutInfo *)&pQVar11[4].super_QLayoutItem,
             (bool)((byte)DVar10.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                          super_QFlagsStorage<QMainWindow::DockOption>.i & 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::restore()
{
    QDockAreaLayoutInfo &savedState = static_cast<QDockWidgetGroupLayout *>(layout())->savedState;
    if (!savedState.isEmpty()) {
        *layoutInfo() = savedState;
        savedState = QDockAreaLayoutInfo();
    }
    currentGapRect = QRect();
    currentGapPos.clear();
    adjustFlags();
    layoutInfo()->fitItems();
    layoutInfo()->apply(static_cast<QMainWindow *>(parentWidget())->dockOptions()
                        & QMainWindow::AnimatedDocks);
}